

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O0

void __thiscall soplex::SPxSolverBase<double>::computeCoTest(SPxSolverBase<double> *this)

{
  bool bVar1;
  int iVar2;
  Verbosity VVar3;
  double *pdVar4;
  int *piVar5;
  streamsize sVar6;
  SPxOut *_spxout;
  SPxOut *_spxout_00;
  long in_RDI;
  double dVar7;
  streamsize prec;
  Verbosity old_verbosity_1;
  Verbosity old_verbosity;
  Status stat;
  Desc *ds;
  int sparsitythreshold;
  double pricingTol;
  int i;
  SPxSolverBase<double> *in_stack_ffffffffffffff68;
  SPxSolverBase<double> *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 local_3c;
  Verbosity local_38 [3];
  Status local_2c;
  Desc *local_28;
  int local_1c;
  double local_18;
  int local_c;
  
  local_18 = leavetol(in_stack_ffffffffffffff68);
  *(undefined1 *)(in_RDI + 0x358) = 1;
  *(undefined8 *)(in_RDI + 0x350) = 0;
  *(undefined4 *)(in_RDI + 0x36c) = 0;
  IdxSet::clear((IdxSet *)(in_RDI + 0x7e8));
  dVar7 = *(double *)(in_RDI + 0x420);
  iVar2 = dim((SPxSolverBase<double> *)0x23b3bf);
  local_1c = (int)(dVar7 * (double)iVar2);
  local_28 = SPxBasisBase<double>::desc((SPxBasisBase<double> *)(in_RDI + 0x1c8));
  local_c = dim((SPxSolverBase<double> *)0x23b3f5);
  while (local_c = local_c + -1, -1 < local_c) {
    local_2c = SPxBasisBase<double>::Desc::coStatus
                         ((Desc *)in_stack_ffffffffffffff70,
                          (int)((ulong)in_stack_ffffffffffffff68 >> 0x20));
    bVar1 = isBasic(in_stack_ffffffffffffff70,(Status)((ulong)in_stack_ffffffffffffff68 >> 0x20));
    if (bVar1) {
      pdVar4 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_ffffffffffffff70,
                          (int)((ulong)in_stack_ffffffffffffff68 >> 0x20));
      *pdVar4 = 0.0;
      if (*(int *)(in_RDI + 0x8a4) == 0) {
        piVar5 = DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x868),local_c);
        *piVar5 = 0;
      }
    }
    else {
      dVar7 = coTest((SPxSolverBase<double> *)
                     CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                     (int)((ulong)in_RDI >> 0x20),(Status)in_RDI);
      pdVar4 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_ffffffffffffff70,
                          (int)((ulong)in_stack_ffffffffffffff68 >> 0x20));
      *pdVar4 = dVar7;
      iVar2 = (int)((ulong)in_stack_ffffffffffffff68 >> 0x20);
      if (*(int *)(in_RDI + 0x8a4) == 0) {
        pdVar4 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_ffffffffffffff70,iVar2);
        if (-local_18 <= *pdVar4) {
          piVar5 = DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x868),local_c);
          *piVar5 = 0;
        }
        else {
          pdVar4 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)in_stack_ffffffffffffff70,
                              (int)((ulong)in_stack_ffffffffffffff68 >> 0x20));
          *(double *)(in_RDI + 0x350) = *(double *)(in_RDI + 0x350) - *pdVar4;
          DIdxSet::addIdx((DIdxSet *)in_stack_ffffffffffffff70,
                          (int)((ulong)in_stack_ffffffffffffff68 >> 0x20));
          piVar5 = DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x868),local_c);
          *piVar5 = 1;
          *(int *)(in_RDI + 0x36c) = *(int *)(in_RDI + 0x36c) + 1;
        }
        iVar2 = IdxSet::size((IdxSet *)(in_RDI + 0x7e8));
        if (local_1c < iVar2) {
          if ((*(long *)(in_RDI + 0x918) != 0) &&
             (VVar3 = SPxOut::getVerbosity(*(SPxOut **)(in_RDI + 0x918)), 3 < (int)VVar3)) {
            local_38[2] = SPxOut::getVerbosity(*(SPxOut **)(in_RDI + 0x918));
            local_38[1] = 4;
            (**(code **)(**(long **)(in_RDI + 0x918) + 0x10))
                      (*(long **)(in_RDI + 0x918),local_38 + 1);
            soplex::operator<<((SPxOut *)in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68
                              );
            soplex::operator<<((SPxOut *)in_stack_ffffffffffffff70,
                               (_func_ostream_ptr_ostream_ptr *)in_stack_ffffffffffffff68);
            (**(code **)(**(long **)(in_RDI + 0x918) + 0x10))
                      (*(long **)(in_RDI + 0x918),local_38 + 2);
          }
          *(undefined4 *)(in_RDI + 0x8a4) = 5;
          *(undefined1 *)(in_RDI + 0x899) = 0;
          IdxSet::clear((IdxSet *)(in_RDI + 0x7e8));
        }
      }
      else {
        pdVar4 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_ffffffffffffff70,iVar2);
        if (*pdVar4 < -local_18) {
          pdVar4 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)in_stack_ffffffffffffff70,
                              (int)((ulong)in_stack_ffffffffffffff68 >> 0x20));
          *(double *)(in_RDI + 0x350) = *(double *)(in_RDI + 0x350) - *pdVar4;
          *(int *)(in_RDI + 0x36c) = *(int *)(in_RDI + 0x36c) + 1;
        }
      }
    }
  }
  iVar2 = IdxSet::size((IdxSet *)(in_RDI + 0x7e8));
  if ((iVar2 == 0) && ((*(byte *)(in_RDI + 0x899) & 1) == 0)) {
    *(int *)(in_RDI + 0x8a4) = *(int *)(in_RDI + 0x8a4) + -1;
  }
  else {
    iVar2 = IdxSet::size((IdxSet *)(in_RDI + 0x7e8));
    if ((iVar2 <= local_1c) && ((*(byte *)(in_RDI + 0x899) & 1) == 0)) {
      if ((*(long *)(in_RDI + 0x918) != 0) &&
         (VVar3 = SPxOut::getVerbosity(*(SPxOut **)(in_RDI + 0x918)), 3 < (int)VVar3)) {
        local_38[0] = SPxOut::getVerbosity(*(SPxOut **)(in_RDI + 0x918));
        local_3c = 4;
        (**(code **)(**(long **)(in_RDI + 0x918) + 0x10))(*(long **)(in_RDI + 0x918),&local_3c);
        sVar6 = SPxOut::precision((SPxOut *)0x23b82a);
        if ((*(byte *)(in_RDI + 0x89c) & 1) == 0) {
          soplex::operator<<((SPxOut *)in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68);
        }
        else {
          soplex::operator<<((SPxOut *)in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68);
        }
        _spxout = soplex::operator<<((SPxOut *)in_stack_ffffffffffffff70,
                                     (char *)in_stack_ffffffffffffff68);
        std::setw(6);
        soplex::operator<<(_spxout,(_Setw)(int)((ulong)in_stack_ffffffffffffff70 >> 0x20));
        _spxout_00 = soplex::operator<<((SPxOut *)in_stack_ffffffffffffff70,
                                        (_func_ios_base_ptr_ios_base_ptr *)_spxout);
        std::setprecision(4);
        soplex::operator<<(_spxout,(_Setprecision)(int)((ulong)_spxout_00 >> 0x20));
        IdxSet::size((IdxSet *)(in_RDI + 0x7e8));
        dim((SPxSolverBase<double> *)0x23b903);
        soplex::operator<<(_spxout_00,(double)_spxout);
        soplex::operator<<(_spxout_00,(_func_ios_base_ptr_ios_base_ptr *)_spxout);
        std::setprecision((int)sVar6);
        soplex::operator<<(_spxout,(_Setprecision)(int)((ulong)_spxout_00 >> 0x20));
        soplex::operator<<(_spxout_00,(_func_ostream_ptr_ostream_ptr *)_spxout);
        (**(code **)(**(long **)(in_RDI + 0x918) + 0x10))(*(long **)(in_RDI + 0x918),local_38);
      }
      *(undefined1 *)(in_RDI + 0x899) = 1;
    }
  }
  return;
}

Assistant:

void SPxSolverBase<R>::computeCoTest()
{
   int i;
   R pricingTol = leavetol();
   m_pricingViolUpToDate = true;
   m_pricingViol = 0;
   m_numViol = 0;
   infeasibilities.clear();
   int sparsitythreshold = (int)(sparsePricingFactor * dim());
   const typename SPxBasisBase<R>::Desc& ds = this->desc();

   for(i = dim() - 1; i >= 0; --i)
   {
      typename SPxBasisBase<R>::Desc::Status stat = ds.coStatus(i);

      if(isBasic(stat))
      {
         theCoTest[i] = 0;

         if(remainingRoundsEnter == 0)
            isInfeasible[i] = SPxPricer<R>::NOT_VIOLATED;
      }
      else
      {
         theCoTest[i] = coTest(i, stat);

         if(remainingRoundsEnter == 0)
         {
            if(theCoTest[i] < -pricingTol)
            {
               assert(infeasibilities.size() < infeasibilities.max());
               m_pricingViol -= theCoTest[i];
               infeasibilities.addIdx(i);
               isInfeasible[i] = SPxPricer<R>::VIOLATED;
               ++m_numViol;
            }
            else
               isInfeasible[i] = SPxPricer<R>::NOT_VIOLATED;

            if(infeasibilities.size() > sparsitythreshold)
            {
               SPX_MSG_INFO2((*this->spxout), (*this->spxout) << " --- using dense pricing"
                             << std::endl;)
               remainingRoundsEnter = SOPLEX_DENSEROUNDS;
               sparsePricingEnter = false;
               infeasibilities.clear();
            }
         }
         else if(theCoTest[i] < -pricingTol)
         {
            m_pricingViol -= theCoTest[i];
            ++m_numViol;
         }
      }
   }

   if(infeasibilities.size() == 0 && !sparsePricingEnter)
      --remainingRoundsEnter;
   else if(infeasibilities.size() <= sparsitythreshold && !sparsePricingEnter)
   {
      SPX_MSG_INFO2((*this->spxout),
                    std::streamsize prec = spxout->precision();

                    if(hyperPricingEnter)
                    (*this->spxout) << " --- using hypersparse pricing, ";
                    else
                       (*this->spxout) << " --- using sparse pricing, ";
                       (*this->spxout) << "sparsity: "
                       << std::setw(6) << std::fixed << std::setprecision(4)
                       << (R) infeasibilities.size() / dim()
                       << std::scientific << std::setprecision(int(prec))
                       << std::endl;)
            sparsePricingEnter = true;
   }
}